

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O1

void newItem(string *path)

{
  pointer pcVar1;
  int num_of_layers;
  int layers;
  int id;
  long lVar2;
  ostream *poVar3;
  undefined1 *puVar4;
  int iVar5;
  size_type *psVar6;
  string names [100];
  char *local_d28;
  long local_d20;
  char local_d18 [16];
  char *local_d08;
  long local_d00;
  char local_cf8 [16];
  string local_ce8;
  string local_cc8;
  string local_ca8 [99];
  undefined8 auStack_48 [2];
  char local_38 [16];
  
  lVar2 = 0x10;
  do {
    puVar4 = (undefined1 *)((long)&local_ca8[0]._M_dataplus._M_p + lVar2);
    *(undefined1 **)((long)local_ca8 + lVar2 + -0x10) = puVar4;
    *(undefined8 *)((long)local_ca8 + lVar2 + -8) = 0;
    *puVar4 = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xc90);
  pcVar1 = (path->_M_dataplus)._M_p;
  local_ce8._M_dataplus._M_p = (pointer)&local_ce8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ce8,pcVar1,pcVar1 + path->_M_string_length);
  num_of_layers = parsePath(&local_ce8,local_ca8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ce8._M_dataplus._M_p != &local_ce8.field_2) {
    operator_delete(local_ce8._M_dataplus._M_p);
  }
  pcVar1 = (path->_M_dataplus)._M_p;
  local_d08 = local_cf8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d08,pcVar1,pcVar1 + path->_M_string_length);
  layers = doesExist(local_ca8,num_of_layers,local_d00 == 0 || *local_d08 != '/');
  if (local_d08 != local_cf8) {
    operator_delete(local_d08);
  }
  if (num_of_layers == layers) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," already exists.\n",0x11);
  }
  else {
    pcVar1 = (path->_M_dataplus)._M_p;
    local_d28 = local_d18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d28,pcVar1,pcVar1 + path->_M_string_length);
    id = getId(local_ca8,layers,local_d20 == 0 || *local_d28 != '/');
    if (local_d28 != local_d18) {
      operator_delete(local_d28);
    }
    iVar5 = num_of_layers - layers;
    if (iVar5 != 0 && layers <= num_of_layers) {
      psVar6 = &local_ca8[layers]._M_string_length;
      do {
        pcVar1 = (((string *)(psVar6 + -1))->_M_dataplus)._M_p;
        local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_cc8,pcVar1,pcVar1 + *psVar6);
        id = makeDirectoryById(id,&local_cc8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
          operator_delete(local_cc8._M_dataplus._M_p);
        }
        psVar6 = psVar6 + 4;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
  }
  lVar2 = 0;
  do {
    if (local_38 + lVar2 != *(char **)((long)auStack_48 + lVar2)) {
      operator_delete(*(char **)((long)auStack_48 + lVar2));
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0xc80);
  return;
}

Assistant:

void newItem(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int exist_layers;
    exist_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (exist_layers == layers)//执行mkdir却发现已经存在
    {
        setColor(COLOR_ERR);
        cout << path << " already exists.\n";
        setColor(COLOR_ORIGIN);
        return;
    }
    int id = getId(names, exist_layers, getPathType(path) == RELATIVE_PATH);
    for (int i = exist_layers; i < layers; i++) {
        id = makeDirectoryById(id, names[i]);
    }
}